

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamToolsIndex::GetOffset
          (BamToolsIndex *this,BamRegion *region,int64_t *offset,bool *hasAlignmentsInRegion)

{
  bool bVar1;
  difference_type __d;
  ulong uVar2;
  ulong uVar3;
  BamException *this_00;
  pointer pBVar4;
  pointer pBVar5;
  pointer pBVar6;
  allocator local_6a;
  allocator local_69;
  BtiReferenceEntry refEntry;
  string local_48;
  
  refEntry.ID = region->LeftRefID;
  if ((refEntry.ID < 0) ||
     ((int)((ulong)((long)(this->m_indexFileSummary).
                          super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_indexFileSummary).
                         super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) <= refEntry.ID)) {
    this_00 = (BamException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&refEntry,"BamToolsIndex::GetOffset",&local_69);
    std::__cxx11::string::string((string *)&local_48,"invalid region requested",&local_6a);
    BamException::BamException(this_00,(string *)&refEntry,&local_48);
    __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
  }
  refEntry.Blocks.
  super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  refEntry.Blocks.
  super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  refEntry.Blocks.
  super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ReadReferenceEntry(this,&refEntry);
  uVar3 = ((long)refEntry.Blocks.
                 super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)refEntry.Blocks.
                super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  pBVar4 = refEntry.Blocks.
           super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar5 = refEntry.Blocks.
           super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (uVar2 = uVar3, 0 < (long)uVar2) {
    uVar3 = uVar2 >> 1;
    pBVar5 = pBVar4 + uVar3;
    if (pBVar4[uVar3].StartPosition <= region->RightPosition) {
      if (region->LeftPosition < pBVar5->MaxEndPosition) {
        *offset = pBVar5->StartOffset;
        break;
      }
      pBVar4 = pBVar5 + 1;
      uVar3 = ~uVar3 + uVar2;
      pBVar5 = pBVar4;
    }
  }
  if (pBVar5 == refEntry.Blocks.
                super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = false;
  }
  else {
    do {
      pBVar6 = pBVar5;
      if (pBVar6 == pBVar4) {
        bVar1 = false;
        goto LAB_0019edec;
      }
      pBVar5 = pBVar6 + -1;
    } while (region->LeftPosition < pBVar6[-1].MaxEndPosition);
    *offset = pBVar6->StartOffset;
    bVar1 = true;
    pBVar6 = pBVar6 + -1;
LAB_0019edec:
    if (pBVar6 == pBVar4) {
      *offset = pBVar6->StartOffset;
      bVar1 = true;
    }
  }
  *hasAlignmentsInRegion = bVar1;
  std::_Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>::
  ~_Vector_base(&refEntry.Blocks.
                 super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
               );
  return;
}

Assistant:

void BamToolsIndex::GetOffset(const BamRegion& region, int64_t& offset, bool* hasAlignmentsInRegion)
{

    // return false ref ID is not a valid index in file summary data
    if (region.LeftRefID < 0 || region.LeftRefID >= (int)m_indexFileSummary.size())
        throw BamException("BamToolsIndex::GetOffset", "invalid region requested");

    // retrieve reference index data for left bound reference
    BtiReferenceEntry refEntry(region.LeftRefID);
    ReadReferenceEntry(refEntry);

    // binary search for an overlapping block (may not be first one though)
    bool found = false;
    typedef BtiBlockVector::const_iterator BtiBlockConstIterator;
    BtiBlockConstIterator blockFirst = refEntry.Blocks.begin();
    BtiBlockConstIterator blockIter = blockFirst;
    BtiBlockConstIterator blockLast = refEntry.Blocks.end();
    std::iterator_traits<BtiBlockConstIterator>::difference_type count =
        std::distance(blockFirst, blockLast);
    std::iterator_traits<BtiBlockConstIterator>::difference_type step;
    while (count > 0) {
        blockIter = blockFirst;
        step = count / 2;
        advance(blockIter, step);

        const BtiBlock& block = (*blockIter);
        if (block.StartPosition <= region.RightPosition) {
            if (block.MaxEndPosition > region.LeftPosition) {
                offset = block.StartOffset;
                break;
            }
            blockFirst = ++blockIter;
            count -= step + 1;
        } else
            count = step;
    }

    // if we didn't search "off the end" of the blocks
    if (blockIter != blockLast) {

        // "walk back" until we've gone too far
        while (blockIter != blockFirst) {
            const BtiBlock& currentBlock = (*blockIter);

            --blockIter;
            const BtiBlock& previousBlock = (*blockIter);
            if (previousBlock.MaxEndPosition <= region.LeftPosition) {
                offset = currentBlock.StartOffset;
                found = true;
                break;
            }
        }

        // if we walked all the way to first block, just return that and let the reader's
        // region overlap parsing do the rest
        if (blockIter == blockFirst) {
            const BtiBlock& block = (*blockIter);
            offset = block.StartOffset;
            found = true;
        }
    }

    // sets to false if blocks container is empty, or if no matching block could be found
    *hasAlignmentsInRegion = found;
}